

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::Triangle::computeUnitNormal(Triangle *this)

{
  Vector<double,_3U> *in_RSI;
  Vector3d *in_RDI;
  Vector3<double> *in_stack_00000020;
  Vector3<double> *in_stack_00000028;
  Vector3<double> *in_stack_ffffffffffffffb8;
  
  *(undefined1 *)((long)((Vector<double,_3U> *)in_RSI[0xc].data_)->data_ + 2) = 1;
  cross<double>(in_stack_00000028,in_stack_00000020);
  Vector3<double>::operator=((Vector3<double> *)in_RSI,in_stack_ffffffffffffffb8);
  Vector<double,_3U>::normalize(in_RSI);
  Vector3<double>::Vector3((Vector3<double> *)in_RSI,in_stack_ffffffffffffffb8);
  return in_RDI;
}

Assistant:

Vector3d Triangle::computeUnitNormal() {
  HaveUnitNormal_ = true;
  unitnormal_     = cross(a_, b_);
  unitnormal_.normalize();
  return unitnormal_;
}